

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
               (VectorWriter *os,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>(os,(m->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    VectorWriter::write(os,(int)p_Var2 + 0x20,(void *)0x20,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Serialize(Stream& os, const std::set<K, Pred, A>& m)
{
    WriteCompactSize(os, m.size());
    for (typename std::set<K, Pred, A>::const_iterator it = m.begin(); it != m.end(); ++it)
        Serialize(os, (*it));
}